

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

void flatbuffers::tests::proto_test_id(string *proto_path,string *proto_file)

{
  bool expval;
  string golden_file;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  IDLOptions opts;
  
  IDLOptions::IDLOptions(&opts);
  opts.include_dependence_headers = false;
  opts.proto_mode = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = NO_OP;
  golden_file._M_dataplus._M_p = (pointer)&golden_file.field_2;
  golden_file._M_string_length = 0;
  golden_file.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_348,proto_path,"test_id.golden.fbs");
  expval = LoadFile(local_348._M_dataplus._M_p,false,&golden_file);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile((proto_path + \"test_id.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x4e,"");
  std::__cxx11::string::~string((string *)&local_348);
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368._M_string_length = 0;
  local_368.field_2._M_local_buf[0] = '\0';
  RunTest(&opts,proto_path,proto_file,&golden_file,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&golden_file);
  IDLOptions::~IDLOptions(&opts);
  return;
}

Assistant:

void proto_test_id(const std::string &proto_path,
                   const std::string &proto_file) {
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = false;
  opts.proto_mode = true;
  opts.keep_proto_id = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  // load the .proto and the golden file from disk
  std::string golden_file;
  TEST_EQ(flatbuffers::LoadFile((proto_path + "test_id.golden.fbs").c_str(),
                                false, &golden_file),
          true);

  RunTest(opts, proto_path, proto_file, golden_file);
}